

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QDockWidgetGroupWindow::paintEvent(QDockWidgetGroupWindow *this,QPaintEvent *param_2)

{
  undefined1 uVar1;
  QWidget *w;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  bool nativeDeco;
  QDockWidgetGroupLayout *lay;
  QStylePainter p;
  QStyleOptionFrame framOpt;
  PrimitiveElement pe;
  undefined7 in_stack_ffffffffffffff70;
  QStyleOption *this_00;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  w = (QWidget *)QWidget::layout((QWidget *)0x5f1624);
  pe = (PrimitiveElement)((ulong)in_RDI >> 0x20);
  uVar1 = QDockWidgetGroupLayout::nativeWindowDeco((QDockWidgetGroupLayout *)0x5f1633);
  if (!(bool)uVar1) {
    memset(local_58,0xaa,0x50);
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5f1662);
    QStyleOption::initFrom(this_00,in_RSI);
    QStylePainter::QStylePainter((QStylePainter *)in_RSI,w);
    QStylePainter::drawPrimitive
              ((QStylePainter *)CONCAT17(uVar1,in_stack_ffffffffffffff70),pe,
               (QStyleOption *)0x5f16b6);
    QStylePainter::~QStylePainter((QStylePainter *)0x5f16c0);
    QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5f16ca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::paintEvent(QPaintEvent *)
{
    QDockWidgetGroupLayout *lay = static_cast<QDockWidgetGroupLayout *>(layout());
    bool nativeDeco = lay->nativeWindowDeco();

    if (!nativeDeco) {
        QStyleOptionFrame framOpt;
        framOpt.initFrom(this);
        QStylePainter p(this);
        p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
    }
}